

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

PtrListIterator *
raviX_ptrlist_reverse_iterator(PtrListIterator *__return_storage_ptr__,PtrList *head)

{
  int iVar1;
  PtrList *pPVar2;
  
  iVar1 = 0;
  if (head == (PtrList *)0x0) {
    pPVar2 = (PtrList *)0x0;
  }
  else {
    pPVar2 = head->prev_;
  }
  __return_storage_ptr__->__list = pPVar2;
  __return_storage_ptr__->__head = pPVar2;
  if (pPVar2 != (PtrList *)0x0) {
    iVar1 = (int)*(char *)pPVar2;
  }
  __return_storage_ptr__->__nr = iVar1;
  return __return_storage_ptr__;
}

Assistant:

PtrListIterator raviX_ptrlist_reverse_iterator(PtrList *head)
{
	PtrListIterator iter;
	iter.__head = iter.__list = head ? head->prev_ : NULL;
	iter.__nr = iter.__head ? iter.__head->nr_ : 0;
	return iter;
}